

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

int sfd_tran_listener_getopt(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_stream_listener_get(*(nng_stream_listener **)((long)arg + 0x2d0),name,buf,szp,t);
  if (iVar1 == 9) {
    iVar1 = nni_getopt(sfd_tran_ep_opts,name,arg,buf,szp,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
sfd_tran_listener_getopt(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	sfd_tran_ep *ep = arg;
	int          rv;

	rv = nni_stream_listener_get(ep->listener, name, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(sfd_tran_ep_opts, name, ep, buf, szp, t);
	}
	return (rv);
}